

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O2

sexp_conflict
sexp_bit_xor(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x,sexp_conflict y)

{
  sexp_uint_t *psVar1;
  ulong *puVar2;
  sexp_conflict psVar3;
  byte bVar4;
  sexp_sint_t sVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  sexp_conflict local_58;
  sexp_conflict local_50;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  
  local_58 = (sexp_conflict)0x43e;
  __sexp_gc_preserver1.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver1.next = (sexp_gc_var_t *)0x0;
  local_50 = (sexp_conflict)0x43e;
  __sexp_gc_preserver2.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver2.next = (sexp_gc_var_t *)0x0;
  if (((ulong)x & 1) == 0) {
    psVar3 = x;
    if ((((ulong)x & 2) == 0) && (x->tag == 0xc)) {
      __sexp_gc_preserver2.next = &__sexp_gc_preserver1;
      __sexp_gc_preserver1.next = (ctx->value).context.saves;
      __sexp_gc_preserver2.var = &local_50;
      (ctx->value).context.saves = &__sexp_gc_preserver2;
      if (((ulong)y & 1) == 0) {
        if ((((ulong)y & 2) == 0) && (y->tag == 0xc)) {
          if ((x->value).type.cpl < (y->value).type.cpl) {
            psVar3 = y;
          }
          __sexp_gc_preserver1.var = &local_58;
          local_58 = (sexp_conflict)sexp_copy_bignum(ctx,0,psVar3,0);
          local_50 = sexp_twos_complement(ctx,y);
LAB_001019ee:
          lVar8 = (local_50->value).fileno.fd;
          sVar5 = lVar8;
          if ((local_58->value).flonum_bits[0] < '\0') {
            sexp_set_twos_complement(local_58);
            sVar5 = (local_50->value).fileno.fd;
          }
          lVar6 = 0;
          if (lVar8 < 1) {
            lVar8 = lVar6;
          }
          for (; lVar8 != lVar6; lVar6 = lVar6 + 1) {
            if (lVar6 < sVar5) {
              uVar7 = *(ulong *)((long)&local_50->value + lVar6 * 8 + 0x10);
            }
            else {
              uVar7 = (ulong)((local_50->value).flonum_bits[0] >> 7);
            }
            puVar2 = (ulong *)((long)&local_58->value + lVar6 * 8 + 0x10);
            *puVar2 = *puVar2 ^ uVar7;
          }
          if (((ulong)y & 1) == 0) {
            bVar4 = (byte)(y->value).flonum_bits[0] >> 7;
          }
          else {
            bVar4 = 1;
          }
          if (bVar4 != (byte)(x->value).flonum_bits[0] >> 7) {
            sexp_set_twos_complement(local_58);
          }
          if ((((ulong)y & 1) != 0) || ((y->value).flonum_bits[0] < '\0')) {
            if ((((ulong)local_58 & 3) == 0) && (local_58->tag == 0xc)) {
              (local_58->value).flonum_bits[0] = -(local_58->value).flonum_bits[0];
            }
            else if (((ulong)local_58 & 1) != 0) {
              local_58 = (sexp_conflict)(1 - ((ulong)local_58 & 0xfffffffffffffffe));
            }
          }
        }
        else {
          __sexp_gc_preserver1.var = &local_58;
          local_58 = (sexp_conflict)sexp_type_exception(ctx,self,2,y);
        }
      }
      else {
        uVar7 = (long)y >> 1;
        __sexp_gc_preserver1.var = &local_58;
        local_58 = (sexp_conflict)sexp_copy_bignum(ctx,0,x,0);
        if ((long)uVar7 < 0) {
          local_50 = sexp_fixnum_to_twos_complement(ctx,y,(x->value).promise.donep);
          goto LAB_001019ee;
        }
        if ((local_58->value).flonum_bits[0] < '\0') {
          sexp_set_twos_complement(local_58);
          psVar1 = &(local_58->value).string.length;
          *psVar1 = *psVar1 ^ uVar7;
          if ((local_58->value).flonum_bits[0] < '\0') {
            sexp_set_twos_complement(local_58);
          }
        }
        else {
          psVar1 = &(local_58->value).string.length;
          *psVar1 = *psVar1 ^ uVar7;
        }
      }
      (ctx->value).context.saves = __sexp_gc_preserver1.next;
      goto LAB_00101943;
    }
  }
  else {
    if (((ulong)y & 1) != 0) {
      local_58 = (sexp_conflict)((ulong)y ^ (ulong)x | 1);
      goto LAB_00101943;
    }
    psVar3 = y;
    if ((((ulong)y & 2) == 0) && (y->tag == 0xc)) {
      local_58 = sexp_bit_xor(ctx,self,n,y,x);
      goto LAB_00101943;
    }
  }
  local_58 = (sexp_conflict)sexp_type_exception(ctx,self,2,psVar3);
LAB_00101943:
  psVar3 = (sexp_conflict)sexp_bignum_normalize(local_58);
  return psVar3;
}

Assistant:

sexp sexp_bit_xor (sexp ctx, sexp self, sexp_sint_t n, sexp x, sexp y) {
#if SEXP_USE_BIGNUMS
  sexp_sint_t len, tmplen, i;
#endif
  sexp_gc_var2(res, tmp);
  if (sexp_fixnump(x)) {
    if (sexp_fixnump(y))
      res = sexp_make_fixnum(sexp_unbox_fixnum(x) ^ sexp_unbox_fixnum(y));
#if SEXP_USE_BIGNUMS
    else if (sexp_bignump(y))
      res = sexp_bit_xor(ctx, self, n, y, x);
#endif
    else
      res = sexp_type_exception(ctx, self, SEXP_FIXNUM, y);
#if SEXP_USE_BIGNUMS
  } else if (sexp_bignump(x)) {
    sexp_gc_preserve2(ctx, res, tmp);
    if (sexp_fixnump(y) && sexp_unbox_fixnum(y) >= 0) {
      res = sexp_copy_bignum(ctx, NULL, x, 0);
      if (sexp_bignum_sign(res) < 0)
        sexp_set_twos_complement(res);
      sexp_bignum_data(res)[0] ^= sexp_unbox_fixnum(y);
      if (sexp_bignum_sign(res) < 0)
        sexp_set_twos_complement(res);
    } else if (sexp_bignump(y) || sexp_fixnump(y)) {
      if (sexp_fixnump(y) || sexp_bignum_length(x) >= sexp_bignum_length(y)) {
        res = sexp_copy_bignum(ctx, NULL, x, 0);
        tmp = sexp_fixnump(y) ? sexp_fixnum_to_twos_complement(ctx, y, sexp_bignum_length(x)) : sexp_twos_complement(ctx, y);
        len = sexp_bignum_length(tmp);
      } else {
        res = sexp_copy_bignum(ctx, NULL, y, 0);
        tmp = sexp_twos_complement(ctx, y);
        len = sexp_bignum_length(tmp);
      }
      if (sexp_bignum_sign(res) < 0)
        sexp_set_twos_complement(res);
      tmplen = sexp_bignum_length(tmp);
      for (i=0; i<len; i++)
        sexp_bignum_data(res)[i] ^= (i<tmplen ? sexp_bignum_data(tmp)[i] : sexp_bignum_sign(tmp) < 0 ? -1 : 0);
      if ((sexp_bignum_sign(x) < 0) ^ (sexp_fixnump(y) || sexp_bignum_sign(y) < 0))
        sexp_set_twos_complement(res);
      if (sexp_fixnump(y) || sexp_bignum_sign(y) < 0) {
        sexp_negate_exact(res);
      }
    } else {
      res = sexp_type_exception(ctx, self, SEXP_FIXNUM, y);
    }
    sexp_gc_release2(ctx);
#endif
  } else {
    res = sexp_type_exception(ctx, self, SEXP_FIXNUM, x);
  }
  return sexp_bignum_normalize(res);
}